

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O0

IterateResult __thiscall vkt::TestCaseExecutor::iterate(TestCaseExecutor *this,TestCase *param_1)

{
  bool bVar1;
  qpTestResult testResult;
  TestContext *this_00;
  char *description;
  undefined1 local_48 [8];
  TestStatus result;
  TestCase *param_1_local;
  TestCaseExecutor *this_local;
  
  result.m_description.field_2._8_8_ = param_1;
  (*this->m_instance->_vptr_TestInstance[2])();
  bVar1 = tcu::TestStatus::isComplete((TestStatus *)local_48);
  if (bVar1) {
    this_00 = Context::getTestContext(&this->m_context);
    testResult = tcu::TestStatus::getCode((TestStatus *)local_48);
    tcu::TestStatus::getDescription_abi_cxx11_((TestStatus *)local_48);
    description = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,testResult,description);
  }
  this_local._4_4_ = (IterateResult)!bVar1;
  tcu::TestStatus::~TestStatus((TestStatus *)local_48);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult TestCaseExecutor::iterate (tcu::TestCase*)
{
	DE_ASSERT(m_instance);

	const tcu::TestStatus	result	= m_instance->iterate();

	if (result.isComplete())
	{
		// Vulkan tests shouldn't set result directly
		DE_ASSERT(m_context.getTestContext().getTestResult() == QP_TEST_RESULT_LAST);
		m_context.getTestContext().setTestResult(result.getCode(), result.getDescription().c_str());
		return tcu::TestNode::STOP;
	}
	else
		return tcu::TestNode::CONTINUE;
}